

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

ON_BrepFace * __thiscall ON_BrepFace::operator=(ON_BrepFace *this,ON_BrepFace *src)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  recursive_mutex *__mutex;
  recursive_mutex *__mutex_00;
  __shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (src != this) {
    ON_SurfaceProxy::operator=(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
    this->m_face_user = src->m_face_user;
    this->m_status = src->m_status;
    this->m_face_index = src->m_face_index;
    ON_SimpleArray<int>::operator=(&this->m_li,&src->m_li);
    this->m_si = src->m_si;
    this->m_bRev = src->m_bRev;
    this->m_face_material_channel = src->m_face_material_channel;
    uVar2 = (src->m_face_uuid).Data2;
    uVar3 = (src->m_face_uuid).Data3;
    uVar1 = *(undefined8 *)(src->m_face_uuid).Data4;
    (this->m_face_uuid).Data1 = (src->m_face_uuid).Data1;
    (this->m_face_uuid).Data2 = uVar2;
    (this->m_face_uuid).Data3 = uVar3;
    *(undefined8 *)(this->m_face_uuid).Data4 = uVar1;
    (this->m_per_face_color).field_0 = (src->m_per_face_color).field_0;
    __mutex_00 = &this->m_pImpl->m_mesh_mutex;
    std::recursive_mutex::lock(__mutex_00);
    __mutex = &src->m_pImpl->m_mesh_mutex;
    std::recursive_mutex::lock(__mutex);
    if ((src->m_pImpl->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      local_38._M_ptr = (element_type *)0x0;
      local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,(__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)src->m_pImpl);
    }
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this->m_pImpl,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    if ((src->m_pImpl->m_analysis_mesh).
        super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
    {
      local_38._M_ptr = (element_type *)0x0;
      local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,
                 &(src->m_pImpl->m_analysis_mesh).
                  super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_pImpl->m_analysis_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    if ((src->m_pImpl->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      local_38._M_ptr = (element_type *)0x0;
      local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,
                 &(src->m_pImpl->m_preview_mesh).
                  super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_pImpl->m_preview_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
  }
  return this;
}

Assistant:

ON_BrepFace& ON_BrepFace::operator=(const ON_BrepFace& src)
{
  if ( &src != this ) 
  {
    // do not copy m_brep pointer
    ON_SurfaceProxy::operator=(src);
    m_face_user   = src.m_face_user;
    m_status      = src.m_status;
    m_face_index  = src.m_face_index;
    m_li    = src.m_li;
    m_si    = src.m_si;
    m_bRev  = src.m_bRev;
    m_face_material_channel = src.m_face_material_channel;
    m_face_uuid = src.m_face_uuid;
    m_per_face_color = src.m_per_face_color;

    std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);
    std::lock_guard<std::recursive_mutex> lock2(src.m_pImpl->m_mesh_mutex);

    m_pImpl->m_render_mesh   = src.m_pImpl->m_render_mesh   ? src.m_pImpl->m_render_mesh   : nullptr;
    m_pImpl->m_analysis_mesh = src.m_pImpl->m_analysis_mesh ? src.m_pImpl->m_analysis_mesh : nullptr;
    m_pImpl->m_preview_mesh  = src.m_pImpl->m_preview_mesh  ? src.m_pImpl->m_preview_mesh  : nullptr;
  }
  return *this;
}